

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O2

void __thiscall Hand::Hand(Hand *this,Hand *toCopy)

{
  vector<CardType,_std::allocator<CardType>_> *this_00;
  allocator_type local_19;
  
  this_00 = (vector<CardType,_std::allocator<CardType>_> *)operator_new(0x18);
  std::vector<CardType,_std::allocator<CardType>_>::vector
            (this_00,(long)(toCopy->handPointer->
                           super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(toCopy->handPointer->
                           super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                           super__Vector_impl_data._M_start >> 2,&local_19);
  this->handPointer = this_00;
  std::vector<CardType,_std::allocator<CardType>_>::operator=(this_00,toCopy->handPointer);
  return;
}

Assistant:

Hand::Hand(Hand &toCopy) {
    handPointer = new std::vector<CardType>(toCopy.getHand()->size());
    *handPointer = *toCopy.handPointer;
}